

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

bool __thiscall helics::TimeDependencies::addDependent(TimeDependencies *this,GlobalFederateId gid)

{
  bool bVar1;
  DependencyInfo *pDVar2;
  iterator iVar3;
  difference_type __d;
  ulong uVar4;
  ulong uVar5;
  const_iterator __position;
  ulong uVar6;
  GlobalFederateId local_c;
  
  __position._M_current =
       (this->dependencies).
       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  pDVar2 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_c.gid = gid.gid;
  if (__position._M_current != pDVar2) {
    if (0 < (long)pDVar2 - (long)__position._M_current) {
      uVar6 = ((ulong)((long)pDVar2 - (long)__position._M_current) >> 3) * 0x2e8ba2e8ba2e8ba3;
      do {
        uVar4 = uVar6 >> 1;
        uVar5 = uVar4;
        if (__position._M_current[uVar4].fedID.gid < gid.gid) {
          uVar5 = ~uVar4 + uVar6;
          __position._M_current = __position._M_current + uVar4 + 1;
        }
        uVar6 = uVar5;
      } while (0 < (long)uVar5);
    }
    if (__position._M_current != pDVar2) {
      if (((__position._M_current)->fedID).gid != gid.gid) {
        iVar3 = std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
                _M_emplace_aux<helics::GlobalFederateId&>
                          ((vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>> *)
                           this,__position,&local_c);
        (iVar3._M_current)->dependent = true;
        return true;
      }
      bVar1 = (__position._M_current)->dependent;
      (__position._M_current)->dependent = true;
      return (bool)(bVar1 ^ 1);
    }
  }
  std::vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>>::
  emplace_back<helics::GlobalFederateId&>
            ((vector<helics::DependencyInfo,std::allocator<helics::DependencyInfo>> *)this,&local_c)
  ;
  (this->dependencies).
  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].dependent = true;
  return true;
}

Assistant:

bool TimeDependencies::addDependent(GlobalFederateId gid)

{
    if (dependencies.empty()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependent = true;
        return true;
    }
    auto dep = std::lower_bound(dependencies.begin(), dependencies.end(), gid, dependencyCompare);
    if (dep == dependencies.end()) {
        dependencies.emplace_back(gid);
        dependencies.back().dependent = true;
    } else {
        if (dep->fedID == gid) {
            auto rval = dep->dependent;
            dep->dependent = true;
            // the dependency is already present
            return !rval;
        }
        auto dependencyIterator = dependencies.emplace(dep, gid);
        dependencyIterator->dependent = true;
    }
    return true;
}